

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::BorderPixel::SetBox(BorderPixel *this,Box box)

{
  size_type sVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  undefined1 local_40 [8];
  Box title_box;
  BorderPixel *this_local;
  Box box_local;
  
  title_box._8_8_ = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  sVar1 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::size(&(this->super_Node).children_);
  this_local._0_4_ = box.x_min;
  this_local._4_4_ = box.x_max;
  box_local.x_min = box.y_min;
  if (sVar1 == 2) {
    Box::Box((Box *)local_40);
    local_40._0_4_ = (int)this_local + 1;
    local_40._4_4_ = this_local._4_4_ + -1;
    title_box.x_min = box_local.x_min;
    title_box.x_max = box_local.x_min;
    p_Var2 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             operator[](&(this->super_Node).children_,1);
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    (*peVar3->_vptr_Node[3])
              (peVar3,CONCAT44(local_40._4_4_,local_40._0_4_),
               CONCAT44(title_box.x_max,title_box.x_min));
  }
  this_local = (BorderPixel *)CONCAT44(this_local._4_4_ + -1,(int)this_local + 1);
  box_local.x_max = box.y_max;
  box_local.x_max = box_local.x_max + -1;
  box_local.x_min = box_local.x_min + 1;
  p_Var2 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::operator[](&(this->super_Node).children_,0);
  peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  (*peVar3->_vptr_Node[3])(peVar3,this_local,box_local._0_8_);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);
    if (children_.size() == 2) {
      Box title_box;
      title_box.x_min = box.x_min + 1;
      title_box.x_max = box.x_max - 1;
      title_box.y_min = box.y_min;
      title_box.y_max = box.y_min;
      children_[1]->SetBox(title_box);
    }
    box.x_min++;
    box.x_max--;
    box.y_min++;
    box.y_max--;
    children_[0]->SetBox(box);
  }